

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_extent_ralloc_large_expand(tsdn_t *tsdn,arena_t *arena,extent_t *extent,size_t oldusize)

{
  size_t oldusize_00;
  
  oldusize_00 = *(size_t *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  arena_large_ralloc_stats_update((tsdn_t *)arena,(arena_t *)oldusize,oldusize_00,oldusize);
  LOCK();
  (arena->nactive).repr = (arena->nactive).repr + (oldusize_00 - oldusize >> 0xc);
  UNLOCK();
  return;
}

Assistant:

void
arena_extent_ralloc_large_expand(tsdn_t *tsdn, arena_t *arena, extent_t *extent,
    size_t oldusize) {
	size_t usize = extent_usize_get(extent);
	size_t udiff = usize - oldusize;

	if (config_stats) {
		arena_stats_lock(tsdn, &arena->stats);
		arena_large_ralloc_stats_update(tsdn, arena, oldusize, usize);
		arena_stats_unlock(tsdn, &arena->stats);
	}
	arena_nactive_add(arena, udiff >> LG_PAGE);
}